

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O3

int __thiscall FIX::FileLog::init(FileLog *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char cVar4;
  int iVar5;
  ConfigError *pCVar6;
  long *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_70;
  string local_50;
  
  file_mkdir(*(char **)ctx);
  file_mkdir((in_RDX->_M_dataplus)._M_p);
  if (*(long *)(ctx + 8) == 0) {
    std::__cxx11::string::_M_replace((ulong)ctx,0,(char *)0x0,0x1c4dca);
  }
  if (in_RDX->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)in_RDX);
  }
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,*in_RCX,in_RCX[1] + *in_RCX);
  std::__cxx11::string::append((char *)&local_50);
  file_appendpath(&local_70,(string *)ctx,&local_50);
  std::__cxx11::string::operator=((string *)&this->m_fullPrefix,(string *)&local_70);
  paVar2 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,*in_RCX,in_RCX[1] + *in_RCX);
  std::__cxx11::string::append((char *)&local_50);
  file_appendpath(&local_70,in_RDX,&local_50);
  std::__cxx11::string::operator=((string *)&this->m_fullBackupPrefix,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_fullPrefix)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (this->m_fullPrefix)._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  std::__cxx11::string::operator=((string *)&this->m_messagesFileName,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_fullPrefix)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (this->m_fullPrefix)._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  std::__cxx11::string::operator=((string *)&this->m_eventFileName,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::open((char *)&this->m_messages,
                      (_Ios_Openmode)(this->m_messagesFileName)._M_dataplus._M_p);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    std::ofstream::open((char *)&this->m_event,
                        (_Ios_Openmode)(this->m_eventFileName)._M_dataplus._M_p);
    iVar5 = std::__basic_file<char>::is_open();
    if ((char)iVar5 != '\0') {
      return iVar5;
    }
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_70,"Could not open event file: ",&this->m_eventFileName);
    ConfigError::ConfigError(pCVar6,&local_70);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_70,"Could not open messages file: ",&this->m_messagesFileName);
  ConfigError::ConfigError(pCVar6,&local_70);
  __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void FileLog::init( std::string path, std::string backupPath, const std::string& prefix )
{
  file_mkdir( path.c_str() );
  file_mkdir( backupPath.c_str() );

  if ( path.empty() ) path = ".";
  if ( backupPath.empty() ) backupPath = path;

  m_fullPrefix
    = file_appendpath(path, prefix + ".");
  m_fullBackupPrefix
    = file_appendpath(backupPath, prefix + ".");

  m_messagesFileName = m_fullPrefix + "messages.current.log";
  m_eventFileName = m_fullPrefix + "event.current.log";

  m_messages.open( m_messagesFileName.c_str(), std::ios::out | std::ios::app );
  if ( !m_messages.is_open() ) throw ConfigError( "Could not open messages file: " + m_messagesFileName );
  m_event.open( m_eventFileName.c_str(), std::ios::out | std::ios::app );
  if ( !m_event.is_open() ) throw ConfigError( "Could not open event file: " + m_eventFileName );
}